

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::AfterEffectModuleChecker::check(AfterEffectModuleChecker *this)

{
  Expression *pEVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  pointer pFVar6;
  reference pvVar7;
  reference this_00;
  AfterEffectFunctionChecker *checker;
  iterator __end3;
  iterator __begin3;
  vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
  *__range3;
  Index i;
  AfterEffectModuleChecker *this_local;
  
  if (((this->beganWithAnyStackIR & 1U) != 0) && (bVar2 = hasAnyStackIR(this), bVar2)) {
    sVar3 = std::
            vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
            ::size(&this->checkers);
    sVar4 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::size(&this->module->functions);
    if (sVar3 != sVar4) {
      error(this);
    }
    for (__range3._4_4_ = 0;
        sVar3 = std::
                vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                ::size(&this->checkers), __range3._4_4_ < sVar3; __range3._4_4_ = __range3._4_4_ + 1
        ) {
      pvVar5 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::operator[](&this->module->functions,(ulong)__range3._4_4_);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(pvVar5);
      pvVar7 = std::
               vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
               ::operator[](&this->checkers,(ulong)__range3._4_4_);
      if (pFVar6 == pvVar7->func) {
        pvVar5 = std::
                 vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ::operator[](&this->module->functions,(ulong)__range3._4_4_);
        pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (pvVar5);
        pEVar1 = pFVar6->body;
        pvVar7 = std::
                 vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                 ::operator[](&this->checkers,(ulong)__range3._4_4_);
        if (pEVar1 != pvVar7->func->body) goto LAB_014d1a8a;
      }
      else {
LAB_014d1a8a:
        error(this);
      }
      pvVar5 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::operator[](&this->module->functions,(ulong)__range3._4_4_);
      pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (pvVar5);
      pvVar7 = std::
               vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
               ::operator[](&this->checkers,(ulong)__range3._4_4_);
      bVar2 = IString::operator!=((IString *)pFVar6,&(pvVar7->name).super_IString);
      if (bVar2) {
        error(this);
      }
    }
    __end3 = std::
             vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
             ::begin(&this->checkers);
    checker = (AfterEffectFunctionChecker *)
              std::
              vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
              ::end(&this->checkers);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::AfterEffectFunctionChecker_*,_std::vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>_>
                                       *)&checker), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<wasm::AfterEffectFunctionChecker_*,_std::vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>_>
                ::operator*(&__end3);
      AfterEffectFunctionChecker::check(this_00);
      __gnu_cxx::
      __normal_iterator<wasm::AfterEffectFunctionChecker_*,_std::vector<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void check() {
    if (beganWithAnyStackIR && hasAnyStackIR()) {
      // If anything changed to the functions, that's not good.
      if (checkers.size() != module->functions.size()) {
        error();
      }
      for (Index i = 0; i < checkers.size(); i++) {
        // Did a pointer change? (a deallocated function could cause that)
        if (module->functions[i].get() != checkers[i].func ||
            module->functions[i]->body != checkers[i].func->body) {
          error();
        }
        // Did a name change?
        if (module->functions[i]->name != checkers[i].name) {
          error();
        }
      }
      // Global function state appears to not have been changed: the same
      // functions are there. Look into their contents.
      for (auto& checker : checkers) {
        checker.check();
      }
    }
  }